

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O3

bool __thiscall
lan::db::append<int>(db *this,db_bit *context,string *name,int value,db_bit_type type)

{
  pointer pcVar1;
  bool bVar2;
  db_bit *pdVar3;
  db_bit *pdVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  this->data = context;
  if (context->type == Container) {
    pdVar4 = context->lin;
    this->data = pdVar4;
    if (pdVar4 != (db_bit *)0x0) {
      do {
        pdVar3 = pdVar4;
        pdVar4 = pdVar3->nex;
      } while (pdVar3->nex != (db_bit *)0x0);
      this->data = pdVar3;
      pdVar4 = (db_bit *)operator_new(0x50);
      (pdVar4->key)._M_dataplus._M_p = (pointer)&(pdVar4->key).field_2;
      (pdVar4->key)._M_string_length = 0;
      (pdVar4->key).field_2._M_local_buf[0] = '\0';
      pdVar4->data = (void *)0x0;
      pdVar4->pre = (db_bit *)0x0;
      pdVar4->nex = (db_bit *)0x0;
      pdVar4->lin = (db_bit *)0x0;
      pdVar4->con = (db_bit *)0x0;
      pdVar3->nex = pdVar4;
      pdVar4->pre = pdVar3;
      this->data = pdVar4;
      if ((int)type < 9) {
        paVar5 = &local_50.field_2;
        pcVar1 = (name->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
        bVar2 = set_bit<int>(this,context,pdVar4,&local_50,type,value);
        _Var6._M_p = local_50._M_dataplus._M_p;
      }
      else {
        paVar5 = &local_60;
        pcVar1 = (name->_M_dataplus)._M_p;
        local_70[0] = paVar5;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,pcVar1,pcVar1 + name->_M_string_length);
        db_bit::~db_bit(pdVar4);
        std::__cxx11::string::_M_assign((string *)pdVar4);
        pdVar4->type = type;
        pdVar4->con = context;
        bVar2 = true;
        _Var6._M_p = (pointer)local_70[0];
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p == paVar5) {
        return bVar2;
      }
      operator_delete(_Var6._M_p,paVar5->_M_allocated_capacity + 1);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool append(lan::db_bit * context, std::string const name, any const value, db_bit_type const type){
            data = context;
            if(data-> type == lan::Container and (data = data->lin)){
                data = get_last_bit(data);
                data->nex = new db_bit; data->nex->pre = data; data = data->nex;
                return ((type < lan::Array) ? set_bit(context, data, name, type, value) : set_bit(context, data, name, type));
            } return false;
        }